

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseImport(Parser *this,ImportRule *importRule)

{
  long lVar1;
  bool bVar2;
  Parser *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  Parser *this_00;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  Parser *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  skipSpace(in_RDI);
  bVar2 = test(in_RSI,(TokenType)((ulong)in_RDI >> 0x20));
  if (bVar2) {
    lexem(in_RSI);
    QString::operator=((QString *)in_RDI,
                       (QString *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    QString::~QString((QString *)0xa3aa9c);
  }
  else {
    bVar2 = testAndParseUri(in_stack_ffffffffffffffe0,
                            (QString *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8)
                           );
    if (!bVar2) {
      bVar2 = false;
      goto LAB_00a3ab6b;
    }
  }
  removeOptionalQuotes((QString *)in_RDI);
  skipSpace(in_RDI);
  bVar2 = testMedium((Parser *)0xa3aadb);
  if (bVar2) {
    bVar2 = parseMedium(this_00,(QStringList *)in_RSI);
    if (bVar2) {
      do {
        bVar2 = test(in_RSI,(TokenType)((ulong)in_RDI >> 0x20));
        if (!bVar2) goto LAB_00a3ab42;
        skipSpace(in_RDI);
        bVar2 = parseNextMedium(in_RSI,(QStringList *)in_RDI);
      } while (bVar2);
      bVar2 = false;
    }
    else {
      bVar2 = false;
    }
  }
  else {
LAB_00a3ab42:
    bVar2 = next(in_RSI,(TokenType)((ulong)in_RDI >> 0x20));
    if (bVar2) {
      skipSpace(in_RDI);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
LAB_00a3ab6b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Parser::parseImport(ImportRule *importRule)
{
    skipSpace();

    if (test(STRING)) {
        importRule->href = lexem();
    } else {
        if (!testAndParseUri(&importRule->href)) return false;
    }
    removeOptionalQuotes(&importRule->href);

    skipSpace();

    if (testMedium()) {
        if (!parseMedium(&importRule->media)) return false;

        while (test(COMMA)) {
            skipSpace();
            if (!parseNextMedium(&importRule->media)) return false;
        }
    }

    if (!next(SEMICOLON)) return false;

    skipSpace();
    return true;
}